

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O2

void SL::WS_LITE::
     start_ping<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
               (shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                *socket,seconds secs)

{
  element_type *peVar1;
  error_code ec;
  string local_1b8 [32];
  ostringstream buffersl134nonesd;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  seconds local_188;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  if (secs.__r == 0) {
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
    ::cancel(&((socket->
               super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->ping_deadline,&ec);
  }
  _buffersl134nonesd = (element_type *)(secs.__r * 1000000000);
  asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
  ::expires_from_now(&((socket->
                       super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr)->ping_deadline,(duration *)&buffersl134nonesd,&ec);
  if (ec._M_value == 0) {
    if (0 < secs.__r) {
      peVar1 = (socket->
               super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      std::
      __shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr((__shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                      *)&buffersl134nonesd,
                     &socket->
                      super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                    );
      local_188.__r = secs.__r;
      asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>
      ::
      async_wait<SL::WS_LITE::start_ping<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>(std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>const&,std::chrono::duration<long,std::ratio<1l,1l>>)::_lambda(std::error_code_const&)_1_>
                ((basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>
                  *)&peVar1->ping_deadline,(type_conflict1 *)&buffersl134nonesd);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_190);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&buffersl134nonesd);
    (**(code **)(*(long *)ec._M_cat + 0x20))(local_1b8,ec._M_cat,ec._M_value);
    std::operator<<((ostream *)&buffersl134nonesd,local_1b8);
    std::__cxx11::string::~string(local_1b8);
    Log(ERROR_log_level,
        "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketProtocol.h"
        ,0x3c,"start_ping",&buffersl134nonesd);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buffersl134nonesd);
  }
  return;
}

Assistant:

void start_ping(const SOCKETTYPE &socket, std::chrono::seconds secs)
    {
        std::error_code ec;
        if (secs.count() == 0)
            socket->ping_deadline.cancel(ec);
        socket->ping_deadline.expires_from_now(secs, ec);
        if (ec) {
            SL_WS_LITE_LOG(Logging_Levels::ERROR_log_level, ec.message());
        }
        else if (secs.count() > 0) {
            socket->ping_deadline.async_wait([socket, secs](const std::error_code &ec) {
                if (ec != asio::error::operation_aborted) {
                    WSMessage msg;
                    char p[] = "ping";
                    msg.Buffer = std::shared_ptr<unsigned char>(new unsigned char[sizeof(p)], [](unsigned char *ptr) { delete[] ptr; });
                    memcpy(msg.Buffer.get(), p, sizeof(p));
                    msg.len = sizeof(p);
                    msg.code = OpCode::PING;
                    msg.data = msg.Buffer.get();
                    sendImpl<isServer>(socket, msg, CompressionOptions::NO_COMPRESSION);
                    start_ping<isServer>(socket, secs);
                }
            });
        }
    }